

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Materials.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::createMaterial_metal(SemanticParser *this,SP *in)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  element_type *peVar7;
  runtime_error *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  SemanticParser *in_RDI;
  SP SVar8;
  size_t N_1;
  size_t N;
  string name;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  it;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
  *__range1;
  SP mat;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffe08;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
  *in_stack_fffffffffffffe10;
  undefined6 in_stack_fffffffffffffe18;
  undefined1 in_stack_fffffffffffffe1e;
  undefined1 in_stack_fffffffffffffe1f;
  element_type *in_stack_fffffffffffffe20;
  element_type *in_stack_fffffffffffffe28;
  undefined6 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe36;
  undefined1 in_stack_fffffffffffffe37;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  element_type *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined1 in_stack_fffffffffffffe4c;
  byte in_stack_fffffffffffffe4e;
  float in_stack_fffffffffffffe50;
  undefined2 in_stack_fffffffffffffe54;
  undefined1 in_stack_fffffffffffffe56;
  float in_stack_fffffffffffffe58;
  undefined2 in_stack_fffffffffffffe5c;
  undefined1 in_stack_fffffffffffffe5e;
  float in_stack_fffffffffffffe60;
  undefined2 in_stack_fffffffffffffe64;
  undefined1 in_stack_fffffffffffffe66;
  SemanticParser *this_01;
  float in_stack_fffffffffffffeac;
  string *in_stack_fffffffffffffeb0;
  ParamSet *in_stack_fffffffffffffeb8;
  string *in_stack_fffffffffffffee8;
  float *in_stack_fffffffffffffef0;
  ParamSet *in_stack_fffffffffffffef8;
  string *in_stack_ffffffffffffff00;
  ParamSet *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff40;
  size_t *in_stack_ffffffffffffff48;
  value_type *in_stack_ffffffffffffff50;
  ParamSet *in_stack_ffffffffffffff58;
  string local_a0 [48];
  string local_70 [48];
  _Self local_40;
  _Self local_38;
  element_type *local_30;
  
  this_01 = in_RDI;
  std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x1b77fb);
  std::make_shared<pbrt::MetalMaterial,std::__cxx11::string&>(in_stack_fffffffffffffe38);
  local_30 = std::
             __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1b7819);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
                *)in_stack_fffffffffffffe08);
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>_>
              *)in_stack_fffffffffffffe08);
  do {
    bVar1 = std::operator!=(&local_38,&local_40);
    if (!bVar1) {
      std::shared_ptr<pbrt::Material>::shared_ptr<pbrt::MetalMaterial,void>
                ((shared_ptr<pbrt::Material> *)in_stack_fffffffffffffe10,
                 (shared_ptr<pbrt::MetalMaterial> *)in_stack_fffffffffffffe08);
      std::shared_ptr<pbrt::MetalMaterial>::~shared_ptr((shared_ptr<pbrt::MetalMaterial> *)0x1b81df)
      ;
      SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           extraout_RDX._M_pi;
      SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)in_RDI;
      return (SP)SVar8.super___shared_ptr<pbrt::Material,_(__gnu_cxx::_Lock_policy)2>;
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                 *)0x1b7876);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::pair(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    std::__cxx11::string::string(local_a0,local_70);
    uVar2 = std::operator==(&in_stack_fffffffffffffe10->first,(char *)in_stack_fffffffffffffe08);
    if ((bool)uVar2) {
      std::__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b78d0);
      in_stack_fffffffffffffe66 =
           syntactic::ParamSet::hasParamTexture
                     (&in_stack_fffffffffffffe20->super_ParamSet,
                      (string *)
                      CONCAT17(in_stack_fffffffffffffe1f,
                               CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
      if ((bool)in_stack_fffffffffffffe66) {
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b78fd);
        syntactic::ParamSet::getParamTexture(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
        findOrCreateTexture(this_01,(SP *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe66,
                                                                  CONCAT24(in_stack_fffffffffffffe64
                                                                           ,
                                                  in_stack_fffffffffffffe60))));
        std::__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b7940);
        std::shared_ptr<pbrt::Texture>::operator=
                  ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe10,
                   (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe08);
        std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b7961);
        std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                  ((shared_ptr<pbrt::syntactic::Texture> *)0x1b796e);
      }
      else {
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b79ee);
        in_stack_fffffffffffffe60 =
             syntactic::ParamSet::getParam1f
                       (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffeac);
        peVar7 = std::
                 __shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1b7a16);
        peVar7->roughness = in_stack_fffffffffffffe60;
      }
    }
    else {
      uVar3 = std::operator==(&in_stack_fffffffffffffe10->first,(char *)in_stack_fffffffffffffe08);
      if ((bool)uVar3) {
        std::
        __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1b7a57);
        in_stack_fffffffffffffe5e =
             syntactic::ParamSet::hasParamTexture
                       (&in_stack_fffffffffffffe20->super_ParamSet,
                        (string *)
                        CONCAT17(in_stack_fffffffffffffe1f,
                                 CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
        if ((bool)in_stack_fffffffffffffe5e) {
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b7a84);
          syntactic::ParamSet::getParamTexture(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
          findOrCreateTexture(this_01,(SP *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe66,
                                                                    CONCAT24(
                                                  in_stack_fffffffffffffe64,
                                                  in_stack_fffffffffffffe60))));
          std::__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b7ac7);
          std::shared_ptr<pbrt::Texture>::operator=
                    ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe10,
                     (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe08);
          std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b7ae8);
          std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                    ((shared_ptr<pbrt::syntactic::Texture> *)0x1b7af5);
        }
        else {
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b7b27);
          in_stack_fffffffffffffe58 =
               syntactic::ParamSet::getParam1f
                         (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                          in_stack_fffffffffffffeac);
          peVar7 = std::
                   __shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1b7b4f);
          peVar7->uRoughness = in_stack_fffffffffffffe58;
        }
      }
      else {
        uVar4 = std::operator==(&in_stack_fffffffffffffe10->first,(char *)in_stack_fffffffffffffe08)
        ;
        if ((bool)uVar4) {
          std::
          __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1b7b90);
          in_stack_fffffffffffffe56 =
               syntactic::ParamSet::hasParamTexture
                         (&in_stack_fffffffffffffe20->super_ParamSet,
                          (string *)
                          CONCAT17(in_stack_fffffffffffffe1f,
                                   CONCAT16(in_stack_fffffffffffffe1e,in_stack_fffffffffffffe18)));
          if ((bool)in_stack_fffffffffffffe56) {
            std::
            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b7bbd);
            syntactic::ParamSet::getParamTexture
                      (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
            findOrCreateTexture(this_01,(SP *)CONCAT17(uVar2,CONCAT16(in_stack_fffffffffffffe66,
                                                                      CONCAT24(
                                                  in_stack_fffffffffffffe64,
                                                  in_stack_fffffffffffffe60))));
            std::__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b7c00);
            std::shared_ptr<pbrt::Texture>::operator=
                      ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe10,
                       (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe08);
            std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b7c21);
            std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                      ((shared_ptr<pbrt::syntactic::Texture> *)0x1b7c2e);
          }
          else {
            std::
            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b7c60);
            in_stack_fffffffffffffe50 =
                 syntactic::ParamSet::getParam1f
                           (in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                            in_stack_fffffffffffffeac);
            peVar7 = std::
                     __shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1b7c88);
            peVar7->vRoughness = in_stack_fffffffffffffe50;
          }
        }
        else {
          uVar5 = std::operator==(&in_stack_fffffffffffffe10->first,
                                  (char *)in_stack_fffffffffffffe08);
          if ((bool)uVar5) {
            std::
            __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1b7cc6);
            in_stack_fffffffffffffe4e =
                 syntactic::ParamSet::getParamBool
                           (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                            SUB81((ulong)in_stack_fffffffffffffef8 >> 0x38,0));
            peVar7 = std::
                     __shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1b7ceb);
            peVar7->remapRoughness = (bool)(in_stack_fffffffffffffe4e & 1);
          }
          else {
            uVar6 = std::operator==(&in_stack_fffffffffffffe10->first,
                                    (char *)in_stack_fffffffffffffe08);
            if ((bool)uVar6) {
              std::
              __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b7d2e);
              in_stack_fffffffffffffe4c =
                   syntactic::ParamSet::hasParam3f
                             ((ParamSet *)
                              CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffe4e,
                                                      CONCAT15(uVar6,CONCAT14(
                                                  in_stack_fffffffffffffe4c,
                                                  in_stack_fffffffffffffe48)))),
                              (string *)in_stack_fffffffffffffe40);
              if ((bool)in_stack_fffffffffffffe4c) {
                in_stack_fffffffffffffe40 =
                     std::
                     __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1b7d58);
                std::
                __shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b7d6a);
                syntactic::ParamSet::getParam3f
                          (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                           in_stack_fffffffffffffee8);
              }
              else {
                in_stack_fffffffffffffef8 = (ParamSet *)0x0;
                std::
                __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b7da3);
                syntactic::ParamSet::getParamPairNf
                          (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
                std::
                __shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b7dce);
                std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                resize((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *
                       )CONCAT17(in_stack_fffffffffffffe37,
                                 CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                       (size_type)in_stack_fffffffffffffe28);
                std::
                __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b7df1);
                std::
                __shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1b7e03);
                std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                data((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *)
                     0x1b7e12);
                syntactic::ParamSet::getParamPairNf
                          (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                           in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
              }
            }
            else {
              in_stack_fffffffffffffe37 =
                   std::operator==(&in_stack_fffffffffffffe10->first,
                                   (char *)in_stack_fffffffffffffe08);
              if ((bool)in_stack_fffffffffffffe37) {
                std::
                __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x1b7e69);
                in_stack_fffffffffffffe36 =
                     syntactic::ParamSet::hasParam3f
                               ((ParamSet *)
                                CONCAT17(uVar5,CONCAT16(in_stack_fffffffffffffe4e,
                                                        CONCAT15(uVar6,CONCAT14(
                                                  in_stack_fffffffffffffe4c,
                                                  in_stack_fffffffffffffe48)))),
                                (string *)in_stack_fffffffffffffe40);
                if ((bool)in_stack_fffffffffffffe36) {
                  in_stack_fffffffffffffe28 =
                       std::
                       __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1b7e93);
                  std::
                  __shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b7ea5);
                  syntactic::ParamSet::getParam3f
                            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8);
                }
                else {
                  in_stack_fffffffffffffef0 = (float *)0x0;
                  std::
                  __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b7ede);
                  syntactic::ParamSet::getParamPairNf
                            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
                  std::
                  __shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b7f09);
                  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                  resize((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>
                          *)CONCAT17(in_stack_fffffffffffffe37,
                                     CONCAT16(in_stack_fffffffffffffe36,in_stack_fffffffffffffe30)),
                         (size_type)in_stack_fffffffffffffe28);
                  in_stack_fffffffffffffe20 =
                       std::
                       __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x1b7f2c);
                  std::
                  __shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b7f3e);
                  std::vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>::
                  data((vector<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_> *
                       )0x1b7f4d);
                  syntactic::ParamSet::getParamPairNf
                            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                             in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
                }
              }
              else {
                in_stack_fffffffffffffe1f =
                     std::operator==(&in_stack_fffffffffffffe10->first,
                                     (char *)in_stack_fffffffffffffe08);
                if ((bool)in_stack_fffffffffffffe1f) {
                  std::
                  __shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pbrt::syntactic::Material,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b7fa4);
                  syntactic::ParamSet::getParamTexture
                            (in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
                  findOrCreateTexture(this_01,(SP *)CONCAT17(uVar2,CONCAT16(
                                                  in_stack_fffffffffffffe66,
                                                  CONCAT24(in_stack_fffffffffffffe64,
                                                           in_stack_fffffffffffffe60))));
                  std::
                  __shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<pbrt::MetalMaterial,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x1b7fe7);
                  std::shared_ptr<pbrt::Texture>::operator=
                            ((shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe10,
                             (shared_ptr<pbrt::Texture> *)in_stack_fffffffffffffe08);
                  std::shared_ptr<pbrt::Texture>::~shared_ptr((shared_ptr<pbrt::Texture> *)0x1b800b)
                  ;
                  std::shared_ptr<pbrt::syntactic::Texture>::~shared_ptr
                            ((shared_ptr<pbrt::syntactic::Texture> *)0x1b8018);
                }
                else {
                  in_stack_fffffffffffffe1e =
                       std::operator==(&in_stack_fffffffffffffe10->first,
                                       (char *)in_stack_fffffffffffffe08);
                  if (!(bool)in_stack_fffffffffffffe1e) {
                    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                    std::operator+((char *)CONCAT17(uVar3,CONCAT16(in_stack_fffffffffffffe5e,
                                                                   CONCAT24(
                                                  in_stack_fffffffffffffe5c,
                                                  in_stack_fffffffffffffe58))),
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(uVar4,CONCAT16(in_stack_fffffffffffffe56,
                                                              CONCAT24(in_stack_fffffffffffffe54,
                                                                       in_stack_fffffffffffffe50))))
                    ;
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)CONCAT17(in_stack_fffffffffffffe1f,
                                               CONCAT16(in_stack_fffffffffffffe1e,
                                                        in_stack_fffffffffffffe18)),(char *)this_00)
                    ;
                    std::runtime_error::runtime_error(this_00,(string *)&stack0xfffffffffffffeb0);
                    __cxa_throw(this_00,&std::runtime_error::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string(local_a0);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>
    ::~pair(in_stack_fffffffffffffe10);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<pbrt::syntactic::Param>_>_>
                  *)in_stack_fffffffffffffe10);
  } while( true );
}

Assistant:

Material::SP SemanticParser::createMaterial_metal(pbrt::syntactic::Material::SP in)
  {
    MetalMaterial::SP mat = std::make_shared<MetalMaterial>(in->name);
    for (auto it : in->param) {
      std::string name = it.first;
      if (name == "roughness") {
        if (in->hasParamTexture(name))
          mat->map_roughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->roughness = in->getParam1f(name);
      }
      else if (name == "uroughness") {
        if (in->hasParamTexture(name))
          mat->map_uRoughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->uRoughness = in->getParam1f(name);
      }
      else if (name == "vroughness") {
        if (in->hasParamTexture(name))
          mat->map_vRoughness = findOrCreateTexture(in->getParamTexture(name));
        else
          mat->vRoughness = in->getParam1f(name);
      }
      else if (name == "remaproughness") {
        mat->remapRoughness = in->getParamBool(name);
      }
      else if (name == "eta") {
        if (in->hasParam3f(name))
          in->getParam3f(&mat->eta.x,name);
        else {
          std::size_t N=0;
          in->getParamPairNf(nullptr,&N,name);
          mat->spectrum_eta.spd.resize(N);
          in->getParamPairNf(mat->spectrum_eta.spd.data(),&N,name);
        }
      }
      else if (name == "k") {
        if (in->hasParam3f(name))
          in->getParam3f(&mat->k.x,name);
        else {
          std::size_t N=0;
          in->getParamPairNf(nullptr,&N,name);
          mat->spectrum_k.spd.resize(N);
          in->getParamPairNf(mat->spectrum_k.spd.data(),&N,name);
        }
      }
      else if (name == "bumpmap") {
        mat->map_bump = findOrCreateTexture(in->getParamTexture(name));
      }
      else if (name == "type") {
        /* ignore */
      } else
        throw std::runtime_error("un-handled metal-material parameter '"+it.first+"'");
    };
    return mat;
  }